

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,char *fromFile,char *toFile,MatchProperties *match_properties)

{
  char *pcVar1;
  cmCommand *pcVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  mode_t perm;
  mode_t permissions;
  undefined1 auStack_218 [2];
  allocator local_216;
  allocator local_215;
  mode_t local_214;
  string local_210;
  MatchProperties *local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [376];
  
  bVar3 = true;
  local_1f0 = match_properties;
  if (this->Always == false) {
    bVar3 = cmFileTimeComparison::FileTimesDiffer(&this->FileTimes,fromFile,toFile);
  }
  bVar4 = false;
  (*this->_vptr_cmFileCopier[4])(this,toFile,0,(ulong)bVar3);
  if (bVar3 != false) {
    std::__cxx11::string::string((string *)&local_1c8,fromFile,&local_215);
    std::__cxx11::string::string((string *)&local_1e8,toFile,&local_216);
    bVar4 = cmsys::SystemTools::CopyAFile(&local_1c8,&local_1e8,true);
    bVar4 = !bVar4;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = this->Name;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)auStack_218 +
                      (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0x70
                     );
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," cannot copy file \"",0x13);
    if (fromFile == (char *)0x0) {
      std::ios::clear((int)auStack_218 +
                      (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0x70
                     );
    }
    else {
      sVar5 = strlen(fromFile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,fromFile,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\" to \"",6);
    if (toFile == (char *)0x0) {
      std::ios::clear((int)auStack_218 +
                      (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) + 0x70
                     );
    }
    else {
      sVar5 = strlen(toFile);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,toFile,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    pcVar2 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(pcVar2,&local_210);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_002db290:
    bVar3 = false;
  }
  else {
    if ((bVar3 != false) && (this->Always == false)) {
      local_214 = 0;
      bVar3 = cmsys::SystemTools::GetPermissions(toFile,&local_214);
      if (bVar3) {
        cmsys::SystemTools::SetPermissions(toFile,local_214 | 0x80,false);
      }
      bVar3 = cmSystemTools::CopyFileTime(fromFile,toFile);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        pcVar1 = this->Name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)auStack_218 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                          0x70);
        }
        else {
          sVar5 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8," cannot set modification time on \"",0x22);
        if (toFile == (char *)0x0) {
          std::ios::clear((int)auStack_218 +
                          (int)*(undefined8 *)(CONCAT44(local_1a8._4_4_,local_1a8._0_4_) + -0x18) +
                          0x70);
        }
        else {
          sVar5 = strlen(toFile);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,toFile,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
        pcVar2 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar2,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        if (!bVar3) goto LAB_002db290;
      }
    }
    local_1a8._0_4_ = local_1f0->Permissions;
    if (local_1a8._0_4_ == 0) {
      local_1a8._0_4_ = this->FilePermissions;
    }
    if (local_1a8._0_4_ == 0) {
      cmsys::SystemTools::GetPermissions(fromFile,(mode_t *)local_1a8);
    }
    bVar3 = SetPermissions(this,toFile,local_1a8._0_4_);
  }
  return bVar3;
}

Assistant:

bool cmFileCopier::InstallFile(const char* fromFile, const char* toFile,
                               MatchProperties const& match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if(!this->Always)
    {
    // If both files exist with the same time do not copy.
    if(!this->FileTimes.FileTimesDiffer(fromFile, toFile))
      {
      copy = false;
      }
    }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if(copy && !cmSystemTools::CopyAFile(fromFile, toFile, true))
    {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile
      << "\" to \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Set the file modification time of the destination file.
  if(copy && !this->Always)
    {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if(cmSystemTools::GetPermissions(toFile, perm))
      {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
      }
    if (!cmSystemTools::CopyFileTime(fromFile, toFile))
      {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \""
        << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    }

  // Set permissions of the destination file.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->FilePermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
    }
  return this->SetPermissions(toFile, permissions);
}